

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MinTypMaxExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::MinTypMaxExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression*&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,Expression *args_2,Expression *args_3,
          Expression **args_4,SourceRange *args_5)

{
  SourceRange sourceRange;
  MinTypMaxExpression *selected;
  MinTypMaxExpression *in_RCX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  Type *in_R8;
  Expression *in_R9;
  undefined8 *in_stack_00000008;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  selected = (MinTypMaxExpression *)
             allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8)
  ;
  sourceRange.endLoc = in_RDI;
  sourceRange.startLoc = in_RSI;
  slang::ast::MinTypMaxExpression::MinTypMaxExpression
            (in_RCX,in_R8,in_R9,(Expression *)in_stack_00000008[1],(Expression *)*in_stack_00000008,
             (Expression *)selected,sourceRange);
  return selected;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }